

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O0

UBool __thiscall icu_63::UVector::containsAll(UVector *this,UVector *other)

{
  int32_t iVar1;
  int local_24;
  int32_t i;
  UVector *other_local;
  UVector *this_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = size(other);
    if (iVar1 <= local_24) {
      return '\x01';
    }
    iVar1 = indexOf(this,other->elements[local_24],0,'\0');
    if (iVar1 < 0) break;
    local_24 = local_24 + 1;
  }
  return '\0';
}

Assistant:

UBool UVector::containsAll(const UVector& other) const {
    for (int32_t i=0; i<other.size(); ++i) {
        if (indexOf(other.elements[i]) < 0) {
            return FALSE;
        }
    }
    return TRUE;
}